

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

double js_math_round(double a)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint s;
  uint e;
  uint64_t one;
  uint64_t frac_mask;
  JSFloat64Union u;
  double a_local;
  
  uVar1 = (uint)((ulong)a >> 0x20);
  uVar2 = uVar1 >> 0x14 & 0x7ff;
  if (uVar2 < 0x3ff) {
    if ((uVar2 == 0x3fe) && (a != -0.5)) {
      u.u64 = (ulong)a & 0x8000000000000000 | 0x3ff0000000000000;
    }
    else {
      u.d = a & 0x8000000000000000;
    }
  }
  else {
    u.d = a;
    if (uVar2 < 0x433) {
      uVar3 = 1L << (0x34U - ((char)uVar2 + '\x01') & 0x3f);
      u.u64 = (uVar3 - 1 ^ 0xffffffffffffffff) & ((uVar3 >> 1) - (ulong)(uVar1 >> 0x1f)) + (long)a;
    }
  }
  return u.d;
}

Assistant:

static double js_math_round(double a)
{
    JSFloat64Union u;
    uint64_t frac_mask, one;
    unsigned int e, s;

    u.d = a;
    e = (u.u64 >> 52) & 0x7ff;
    if (e < 1023) {
        /* abs(a) < 1 */
        if (e == (1023 - 1) && u.u64 != 0xbfe0000000000000) {
            /* abs(a) > 0.5 or a = 0.5: return +/-1.0 */
            u.u64 = (u.u64 & ((uint64_t)1 << 63)) | ((uint64_t)1023 << 52);
        } else {
            /* return +/-0.0 */
            u.u64 &= (uint64_t)1 << 63;
        }
    } else if (e < (1023 + 52)) {
        s = u.u64 >> 63;
        one = (uint64_t)1 << (52 - (e - 1023));
        frac_mask = one - 1;
        u.u64 += (one >> 1) - s;
        u.u64 &= ~frac_mask; /* truncate to an integer */
    }
    /* otherwise: abs(a) >= 2^52, or NaN, +/-Infinity: no change */
    return u.d;
}